

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

parser_error parse_renderer_colors(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *__s;
  size_t sVar3;
  int *attr;
  int iVar4;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s = parser_getstr(p,"colors");
    mem_free(*(void **)((long)pvVar2 + 0x10));
    sVar3 = strlen(__s);
    iVar4 = 0x40;
    if (sVar3 < 0x40) {
      iVar4 = (int)sVar3;
    }
    *(int *)((long)pvVar2 + 0x40) = iVar4;
    attr = (int *)mem_alloc((ulong)(uint)(iVar4 << 2));
    *(int **)((long)pvVar2 + 0x10) = attr;
    convert_chars_to_attrs(__s,*(wchar_t *)((long)pvVar2 + 0x40),attr);
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_renderer_colors(struct parser *p)
{
	struct renderer_info *renderer = parser_priv(p);
	const char *colors;
	size_t n;

	if (!renderer) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	colors = parser_getstr(p, "colors");
	mem_free(renderer->colors);
	n = strlen(colors);
	renderer->ncolors = (n < MAX_PALETTE) ? (int) n : MAX_PALETTE;
	renderer->colors = mem_alloc(renderer->ncolors *
		sizeof(*renderer->colors));
	convert_chars_to_attrs(colors, renderer->ncolors, renderer->colors);
	return PARSE_ERROR_NONE;
}